

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall spvtools::opt::analysis::Image::IsSameImpl(Image *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x12])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (((((lVar3 != 0) && (this->dim_ == *(Dim *)(lVar3 + 0x30))) &&
       (this->depth_ == *(uint32_t *)(lVar3 + 0x34))) &&
      ((this->arrayed_ == (bool)*(char *)(lVar3 + 0x38) &&
       (this->ms_ == (bool)*(char *)(lVar3 + 0x39))))) &&
     ((this->sampled_ == *(uint32_t *)(lVar3 + 0x3c) &&
      ((this->format_ == *(ImageFormat *)(lVar3 + 0x40) &&
       (this->access_qualifier_ == *(AccessQualifier *)(lVar3 + 0x44))))))) {
    iVar2 = (*this->sampled_type_->_vptr_Type[2])
                      (this->sampled_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    if ((char)iVar2 != '\0') {
      bVar1 = Type::HasSameDecorations(&this->super_Type,that);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Image::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Image* it = that->AsImage();
  if (!it) return false;
  return dim_ == it->dim_ && depth_ == it->depth_ && arrayed_ == it->arrayed_ &&
         ms_ == it->ms_ && sampled_ == it->sampled_ && format_ == it->format_ &&
         access_qualifier_ == it->access_qualifier_ &&
         sampled_type_->IsSameImpl(it->sampled_type_, seen) &&
         HasSameDecorations(that);
}